

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::FragmentOutputCase::iterate(FragmentOutputCase *this)

{
  byte bVar1;
  DataType DVar2;
  pointer pBVar3;
  undefined8 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  ChannelOrder CVar10;
  Vec4 VVar11;
  bool bVar12;
  int i;
  int iVar13;
  TextureChannelClass TVar14;
  int iVar15;
  uint uVar16;
  deUint32 dVar17;
  int iVar18;
  undefined4 extraout_var;
  pointer pBVar19;
  pointer pfVar20;
  ostream *poVar21;
  long lVar22;
  TextureFormat *pTVar23;
  undefined8 *puVar24;
  TransferFormat TVar25;
  undefined1 *puVar26;
  undefined4 *puVar27;
  float *pfVar28;
  TestError *pTVar29;
  int i_9;
  int iVar30;
  int iVar31;
  pointer pFVar32;
  TextureFormat *pTVar33;
  ulong *puVar34;
  undefined4 *puVar35;
  float *pfVar36;
  int i_8;
  uint uVar37;
  undefined4 uVar38;
  undefined8 *puVar39;
  char *description;
  int i_4;
  ChannelOrder CVar40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long lVar41;
  pointer puVar42;
  unsigned_short uVar43;
  ulong uVar44;
  pointer pfVar45;
  TextureFormat *pTVar46;
  undefined4 *puVar47;
  float *pfVar48;
  int x;
  pointer puVar49;
  unsigned_short uVar50;
  uint uVar51;
  ChannelType CVar52;
  int iVar53;
  pointer pAVar54;
  ChannelType CVar55;
  pointer unaff_R13;
  pointer pAVar56;
  int iVar57;
  long lVar58;
  pointer pFVar59;
  int iVar60;
  ulong uVar61;
  TextureFormat TVar62;
  TextureFormat TVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  Vec4 minVal;
  Vec4 maxVal;
  IVec4 minVal_1;
  TextureFormat readFmt;
  IVec4 step;
  Vector<int,_4> res_9;
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  attachments;
  BVec4 isZero;
  IVec4 maxVal_1;
  IVec4 rangeDiv;
  BVec4 cmpMask;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> drawBuffers;
  TextureFormat refFmt;
  TextureFormat texFmt;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<float,_std::allocator<float>_> positions;
  undefined1 local_608 [8];
  TextureFormat TStack_600;
  ulong local_5f8;
  TextureFormat TStack_5f0;
  TextureFormat local_5e8;
  TextureFormat TStack_5e0;
  ulong local_5d8;
  TextureFormat TStack_5d0;
  undefined1 local_5c8 [8];
  TextureFormat TStack_5c0;
  ulong local_5b8;
  undefined8 uStack_5b0;
  undefined1 local_5a8 [8];
  TextureFormat TStack_5a0;
  ulong local_598;
  TextureFormat TStack_590;
  ulong local_580;
  ChannelOrder local_574;
  pointer local_570;
  undefined1 local_568 [16];
  pointer local_558;
  ulong local_550;
  int local_544;
  ulong local_540;
  undefined1 local_538 [12];
  float fStack_52c;
  ulong local_528 [3];
  ulong local_510;
  float local_508;
  float local_504;
  ulong local_500;
  Vec4 local_4f8;
  uint local_4dc;
  undefined1 local_4d8 [16];
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  local_4c8;
  undefined1 local_4a8 [16];
  ulong local_498 [2];
  ulong local_488;
  long local_480;
  TextureFormat local_478;
  long local_470;
  TextureFormat local_468;
  TextureFormat TStack_460;
  ulong local_458 [2];
  undefined8 local_448;
  undefined8 uStack_440;
  ulong local_438 [2];
  undefined4 local_428;
  undefined4 uStack_424;
  undefined8 uStack_420;
  ulong local_410;
  ulong local_408;
  ulong local_400;
  pointer local_3f8;
  long local_3f0;
  pointer local_3e8;
  uint local_3e0;
  uint local_3dc;
  float local_3d8 [6];
  ulong local_3c0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3a0;
  undefined1 local_388 [24];
  TextureFormat TStack_370;
  ios_base local_318 [272];
  undefined1 local_208 [8];
  TextureFormat TStack_200;
  float local_1f8 [2];
  int aiStack_1f0 [22];
  ios_base local_198 [8];
  ios_base local_190 [264];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_88;
  vector<float,_std::allocator<float>_> local_70;
  long local_58;
  pointer local_50;
  float local_48 [6];
  
  local_568._8_8_ = local_568._0_8_;
  local_478 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_480 = CONCAT44(extraout_var,iVar13);
  pBVar19 = (this->m_fboSpec).
            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (this->m_fboSpec).
           super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar19 == pBVar3) {
    local_408 = 0x7fffffff;
    local_400 = 0x7fffffff;
  }
  else {
    local_400 = 0x7fffffff;
    local_408 = 0x7fffffff;
    do {
      if (pBVar19->width <= (int)local_400) {
        local_400 = (ulong)(uint)pBVar19->width;
      }
      if (pBVar19->height <= (int)local_408) {
        local_408 = (ulong)(uint)pBVar19->height;
      }
      pBVar19 = pBVar19 + 1;
    } while (pBVar19 != pBVar3);
  }
  iVar13 = (int)local_400;
  iVar60 = iVar13 + 7;
  if (-1 < iVar13) {
    iVar60 = iVar13;
  }
  uVar37 = iVar60 >> 3;
  if (0xfe < (int)uVar37) {
    uVar37 = 0xff;
  }
  if ((int)uVar37 < 2) {
    uVar37 = 1;
  }
  local_540 = (ulong)uVar37;
  iVar13 = (int)local_408;
  iVar60 = iVar13 + 7;
  if (-1 < iVar13) {
    iVar60 = iVar13;
  }
  uVar51 = iVar60 >> 3;
  if (0xfe < (int)uVar51) {
    uVar51 = 0xff;
  }
  if ((int)uVar51 < 2) {
    uVar51 = 1;
  }
  CVar40 = uVar37 + A;
  local_410 = (ulong)(uVar51 + 1);
  local_3c0 = (ulong)(CVar40 * (uVar51 + 1));
  pFVar32 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar59 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar44 = 0;
  if (pFVar32 != pFVar59) {
    do {
      iVar13 = pFVar32->arrayLength;
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      uVar37 = (int)uVar44 + iVar13;
      uVar44 = (ulong)uVar37;
      pFVar32 = pFVar32 + 1;
    } while (pFVar32 != pFVar59);
    uVar44 = (ulong)(int)uVar37;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_3b8,uVar44,(allocator_type *)local_208);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_70,(ulong)(uint)((int)local_3c0 * 4),(allocator_type *)local_208);
  local_568._0_4_ = (int)local_540 * uVar51;
  local_568._4_4_ = 0;
  uVar37 = local_568._0_4_ * 6;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_88,(ulong)uVar37,(allocator_type *)local_208);
  uVar61 = (long)(this->m_fboSpec).
                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_fboSpec).
                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_488 = uVar61 >> 4;
  uVar44 = (ulong)(int)local_488;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_3a0,uVar44,(allocator_type *)local_208);
  if (0x199999999999999 < uVar44) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  uVar61 = uVar61 * 0x10000000;
  local_4c8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_574 = CVar40;
  if (uVar61 == 0) {
    local_4c8.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    local_4c8.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(uVar44 * 0x50);
  }
  local_4c8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_4c8.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
       ._M_impl.super__Vector_impl_data._M_start + uVar44;
  local_4c8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_4c8.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (uVar61 != 0) {
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->readFormat).order = R;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->readFormat).type = SNORM_INT8;
    (local_4c8.
     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
     ._M_impl.super__Vector_impl_data._M_finish)->numWrittenChannels = 0;
    (local_4c8.
     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
     ._M_impl.super__Vector_impl_data._M_finish)->outPrecision = PRECISION_LOWP;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined4 *)
     &(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
       &(local_4c8.
         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
         ._M_impl.super__Vector_impl_data._M_finish)->format)->_M_impl).super__Vector_impl_data.
      _M_start = 0x15;
    *(undefined4 *)
     ((long)&(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
              &(local_4c8.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_finish)->format)->_M_impl).
             super__Vector_impl_data._M_start + 4) = 0x26;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceFormat).order = 0x15;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceFormat).type = CHANNELTYPE_LAST;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->readFormat).order = CHANNELORDER_LAST;
    ((local_4c8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->readFormat).type = CHANNELTYPE_LAST;
    local_4c8.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_4c8.
         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    uVar44 = uVar44 - 1;
    uVar61 = uVar44;
  }
  local_510 = (ulong)uVar51;
  local_3e0 = uVar37;
  if (0 < (int)(uint)local_488) {
    uVar37 = (uint)local_488 & 0x7fffffff;
    this_00 = &(local_4c8.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start)->renderedData;
    lVar58 = 0x38;
    lVar41 = 0;
    uVar44 = 0;
    do {
      local_208 = (undefined1  [8])
                  glu::mapGLInternalFormat
                            ((&((this->m_fboSpec).
                                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                ._M_impl.super__Vector_impl_data._M_start)->format)[lVar41]);
      TVar14 = tcu::getTextureChannelClass(local_208._4_4_);
      if (TVar14 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        local_388._4_4_ = FLOAT;
        local_388._0_4_ = local_208._0_4_;
      }
      else {
        local_388._0_8_ = local_208;
      }
      local_5a8 = (undefined1  [8])FboTestUtil::getFramebufferReadFormat((TextureFormat *)local_208)
      ;
      pBVar19 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar13 = (&pBVar19->width)[lVar41];
      iVar60 = (&pBVar19->height)[lVar41];
      *(int *)((long)local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar41) = (int)uVar44 + 0x8ce0;
      this_00[-2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_208;
      *(undefined1 (*) [8])&((TextureFormat *)(this_00 + -1))[1].order = local_5a8;
      *(ChannelOrder *)
       &this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_388._0_4_;
      *(undefined4 *)
       ((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start + 4) = local_388._4_4_;
      iVar15 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_5a8);
      iVar60 = iVar60 * iVar13;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this_00,(long)(iVar15 * iVar60));
      pAVar56 = local_4c8.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar13 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_388);
      unaff_R13 = (pointer)((long)&(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &pAVar56->format)->_M_impl).super__Vector_impl_data._M_start +
                           lVar58);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_R13,
                 (long)(iVar60 * iVar13));
      uVar44 = uVar44 + 1;
      lVar41 = lVar41 + 4;
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &this_00[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      lVar58 = lVar58 + 0x50;
    } while (uVar37 != uVar44);
  }
  puVar49 = local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start + 5;
  uVar44 = 0;
  do {
    sVar5 = (short)(uVar44 / (local_540 & 0xffffffff));
    sVar6 = (short)uVar44;
    puVar49[-5] = sVar5 + sVar6;
    sVar8 = (short)((uVar44 & 0xffffffff) / (local_540 & 0xffffffff));
    sVar7 = (sVar8 + 1) * (short)local_574;
    sVar8 = sVar8 * -(short)local_540;
    uVar50 = sVar6 + sVar8 + sVar7;
    puVar49[-4] = uVar50;
    uVar43 = sVar5 + sVar6 + 1;
    puVar49[-3] = uVar43;
    puVar49[-2] = uVar50;
    puVar49[-1] = sVar8 + sVar7 + sVar6 + 1;
    *puVar49 = uVar43;
    uVar44 = uVar44 + 1;
    puVar49 = puVar49 + 6;
  } while ((uint)local_568._0_4_ != uVar44);
  local_504 = (float)(int)local_540;
  local_508 = (float)(int)local_510;
  pfVar20 = local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + 3;
  uVar44 = 0;
  do {
    fVar64 = (float)(int)uVar44 / local_508;
    uVar61 = 0;
    pfVar45 = pfVar20;
    do {
      fVar65 = (float)(int)uVar61 / local_504;
      pfVar45[-3] = fVar65 + fVar65 + -1.0;
      pfVar45[-2] = fVar64 + fVar64 + -1.0;
      pfVar45[-1] = 0.0;
      pfVar45[0] = 1.0;
      uVar61 = uVar61 + 1;
      pfVar45 = pfVar45 + 4;
    } while (CONCAT44(0,local_574) != uVar61);
    uVar44 = uVar44 + 1;
    pfVar20 = pfVar20 + (local_540 & 0xffffffff) * 4 + 4;
  } while (uVar44 != local_410);
  local_568._0_8_ = CONCAT44(0,local_574);
  pFVar32 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar32) >> 4)) {
    lVar41 = 0;
    pFVar59 = (pointer)0x0;
    uVar44 = local_510;
    do {
      DVar2 = pFVar32[lVar41].type;
      iVar13 = pFVar32[lVar41].arrayLength;
      local_58 = lVar41;
      uVar37 = glu::getDataTypeScalarSize(DVar2);
      pFVar32 = pFVar32 + lVar41;
      local_4dc = DVar2 - TYPE_FLOAT;
      local_3dc = DVar2 - TYPE_INT;
      local_50 = (pointer)(ulong)(DVar2 - TYPE_UINT);
      local_3e8 = (pointer)(long)(int)(uVar37 * (int)local_3c0);
      local_500 = (ulong)(int)uVar37;
      local_544 = local_574 * uVar37;
      local_4d8._0_8_ = (ulong)uVar37 << 2;
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      local_580 = local_580 & 0xffffffff00000000;
      local_3f0 = CONCAT44(local_3f0._4_4_,iVar13);
      local_3f8 = pFVar32;
      do {
        lVar41 = (long)(int)pFVar59 * 3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (local_3b8.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)pFVar59,(size_type)local_3e8);
        iVar13 = pFVar32->location + (uint)local_580;
        local_4c8.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar13].numWrittenChannels = uVar37;
        uVar61 = (ulong)pFVar32->precision;
        local_4c8.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar13].outPrecision = pFVar32->precision;
        local_558 = pFVar59;
        local_470 = lVar41;
        if (local_4dc < 4) {
          if (getFloatRange(glu::Precision)::ranges == '\0') {
            iterate();
          }
          uVar38 = *(undefined4 *)(getFloatRange(glu::Precision)::ranges + uVar61 * 8);
          CVar40 = *(ChannelOrder *)(getFloatRange(glu::Precision)::ranges + uVar61 * 8 + 4);
          lVar41 = 0;
          do {
            *(undefined4 *)(local_608 + lVar41 * 4) = uVar38;
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          lVar41 = 0;
          do {
            (&local_5e8.order)[lVar41] = CVar40;
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          local_570 = (&((local_3b8.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[local_470];
          iVar13 = pFVar32->location + (uint)local_580;
          if ((-1 < iVar13) &&
             (iVar13 < (int)((ulong)((long)local_4c8.
                                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_4c8.
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x33333333)) {
            tcu::getTextureFormatInfo
                      ((TextureFormatInfo *)local_208,
                       &local_4c8.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(int)(pFVar32->location + (uint)local_580)].format);
            local_388._0_4_ = R;
            local_388._4_4_ = SNORM_INT8;
            local_388._8_4_ = R;
            local_388._12_4_ = SNORM_INT8;
            lVar41 = 0;
            do {
              uVar51 = -(uint)(*(float *)(local_208 + lVar41 * 4) <=
                              *(float *)(local_608 + lVar41 * 4));
              *(uint *)(local_388 + lVar41 * 4) =
                   ~uVar51 & (uint)*(float *)(local_208 + lVar41 * 4) |
                   (uint)*(float *)(local_608 + lVar41 * 4) & uVar51;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_608 = (undefined1  [8])local_388._0_8_;
            TStack_600.order = local_388._8_4_;
            TStack_600.type = local_388._12_4_;
            local_388._0_4_ = R;
            local_388._4_4_ = SNORM_INT8;
            local_388._8_4_ = R;
            local_388._12_4_ = SNORM_INT8;
            lVar41 = 0;
            do {
              uVar51 = -(uint)((float)(&local_5e8.order)[lVar41] <= local_1f8[lVar41]);
              *(ChannelOrder *)(local_388 + lVar41 * 4) =
                   ~uVar51 & (uint)local_1f8[lVar41] | (&local_5e8.order)[lVar41] & uVar51;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_5e8.order = local_388._0_4_;
            local_5e8.type = local_388._4_4_;
            TStack_5e0.order = local_388._8_4_;
            TStack_5e0.type = local_388._12_4_;
          }
          local_208 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_200,"out",3);
          std::ostream::operator<<(&TStack_200,(int)local_558);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&TStack_200," value range: ",0xe);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,"(",1);
          lVar41 = 0;
          do {
            if (lVar41 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,", ",2);
            }
            if (lVar41 < (long)local_500) {
              poVar21 = std::ostream::_M_insert<double>((double)*(float *)(local_608 + lVar41 * 4));
              std::__ostream_insert<char,std::char_traits<char>>(poVar21," -> ",4);
              std::ostream::_M_insert<double>((double)(float)(&local_5e8.order)[lVar41]);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,"Undef",5);
            }
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,")",1);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
          std::ios_base::~ios_base(local_318);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&TStack_200,(char *)local_5a8,(long)TStack_5a0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_5a8 != (undefined1  [8])&local_598) {
            operator_delete((void *)local_5a8,local_598 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_200);
          std::ios_base::~ios_base(local_190);
          uVar51 = (uint)local_558;
          uVar16 = uVar51 + 7;
          if (-1 < (int)uVar51) {
            uVar16 = uVar51;
          }
          lVar41 = (long)(int)(uVar51 - (uVar16 & 0xfffffff8)) * 0x10;
          iVar13 = *(int *)(s_swizzles + lVar41);
          iVar60 = *(int *)(s_swizzles + lVar41 + 4);
          unaff_R13 = (pointer)(long)*(int *)(s_swizzles + lVar41 + 8);
          iVar15 = *(int *)(s_swizzles + lVar41 + 0xc);
          uVar61 = 0;
          lVar41 = local_568._0_8_;
          do {
            local_550 = uVar61;
            iVar57 = local_544 * (int)uVar61;
            local_4a8._0_4_ = (float)(int)uVar61 / local_508;
            lVar58 = 0;
            do {
              fVar64 = (float)(int)lVar58 / local_504;
              local_388._0_4_ = ((float)local_4a8._0_4_ + fVar64) * 0.5;
              local_388._4_4_ = (fVar64 - (float)local_4a8._0_4_) * 0.5 + 0.5;
              local_388._12_4_ = 1.0 - (float)local_388._4_4_;
              local_388._8_4_ = 1.0 - (float)local_388._0_4_;
              local_208._4_4_ = *(ChannelType *)(local_388 + (long)iVar60 * 4);
              local_208._0_4_ = *(ChannelOrder *)(local_388 + (long)iVar13 * 4);
              TStack_200.type = *(ChannelType *)(local_388 + (long)iVar15 * 4);
              TStack_200.order = *(ChannelOrder *)(local_388 + (long)unaff_R13 * 4);
              local_5c8._0_4_ = 0.0;
              local_5c8._4_4_ = 0.0;
              TStack_5c0.order = R;
              TStack_5c0.type = SNORM_INT8;
              lVar22 = 0;
              do {
                *(float *)(local_5c8 + lVar22 * 4) =
                     (float)(&local_5e8.order)[lVar22] - *(float *)(local_608 + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              local_5a8._0_4_ = R;
              local_5a8._4_4_ = SNORM_INT8;
              TStack_5a0.order = R;
              TStack_5a0.type = SNORM_INT8;
              lVar22 = 0;
              do {
                *(float *)(local_5a8 + lVar22 * 4) =
                     *(float *)(local_5c8 + lVar22 * 4) * *(float *)(local_208 + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              local_388._0_4_ = R;
              local_388._4_4_ = SNORM_INT8;
              local_388._8_4_ = R;
              local_388._12_4_ = SNORM_INT8;
              lVar22 = 0;
              do {
                *(float *)(local_388 + lVar22 * 4) =
                     *(float *)(local_608 + lVar22 * 4) + *(float *)(local_5a8 + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              if (0 < (int)uVar37) {
                memcpy(local_570 + (int)(uVar37 * (int)lVar58 + iVar57),local_388,local_4d8._0_8_);
                lVar41 = local_568._0_8_;
              }
              lVar58 = lVar58 + 1;
            } while (lVar58 != lVar41);
            uVar61 = (ulong)((int)local_550 + 1);
            uVar44 = local_510;
            pFVar32 = local_3f8;
          } while ((int)local_550 != (int)local_510);
        }
        else if (local_3dc < 4) {
          if (getIntRange(glu::Precision)::ranges == '\0') {
            iterate();
          }
          uVar4 = *(undefined8 *)(getIntRange(glu::Precision)::ranges + uVar61 * 8);
          lVar41 = 0;
          do {
            *(int *)(local_5c8 + lVar41 * 4) = (int)uVar4;
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          lVar41 = 0;
          do {
            (&local_468.order)[lVar41] = (ChannelOrder)((ulong)uVar4 >> 0x20);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          iVar13 = pFVar32->location + (uint)local_580;
          if ((-1 < iVar13) &&
             (iVar13 < (int)((ulong)((long)local_4c8.
                                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_4c8.
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x33333333)) {
            tcu::getTextureFormatBitDepth
                      ((tcu *)&local_5e8,
                       &local_4c8.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(int)(pFVar32->location + (uint)local_580)].format);
            local_208._0_4_ = R;
            local_208._4_4_ = SNORM_INT8;
            TStack_200.order = R;
            TStack_200.type = SNORM_INT8;
            local_498[0] = local_498[0] & 0xffffffff00000000;
            lVar41 = 0;
            do {
              *(bool *)((long)local_498 + lVar41) =
                   (int)(&local_5e8.order)[lVar41] <= *(int *)(local_208 + lVar41 * 4);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            lVar41 = 0;
            do {
              *(undefined8 *)(local_5a8 + lVar41 * 8) = 1;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            _local_538 = (float  [4])ZEXT816(0);
            lVar41 = 0;
            do {
              *(ChannelOrder *)(local_538 + lVar41 * 4) = (&local_5e8.order)[lVar41] - A;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_5f8 = 0;
            TStack_5f0.order = R;
            TStack_5f0.type = SNORM_INT8;
            local_608._0_4_ = R;
            local_608._4_4_ = SNORM_INT8;
            TStack_600.order = 0;
            TStack_600.type = 0;
            lVar41 = 0;
            do {
              *(long *)(local_608 + lVar41 * 8) = (long)*(int *)(local_538 + lVar41 * 4);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_388._16_8_ = (pointer)0x0;
            TStack_370.order = 0;
            TStack_370.type = 0;
            local_388._0_4_ = R;
            local_388._4_4_ = SNORM_INT8;
            local_388._8_8_ = (pointer)0x0;
            lVar41 = 0;
            do {
              *(long *)(local_388 + lVar41 * 8) =
                   *(long *)(local_5a8 + lVar41 * 8) << (local_608[lVar41 * 8] & 0x3f);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_1f8[0] = 0.0;
            local_1f8[1] = 0.0;
            aiStack_1f0[0] = 0;
            aiStack_1f0[1] = 0;
            local_208._0_4_ = R;
            local_208._4_4_ = SNORM_INT8;
            TStack_200.order = R;
            TStack_200.type = SNORM_INT8;
            lVar41 = 0;
            do {
              *(long *)(local_208 + lVar41 * 8) = -*(long *)(local_388 + lVar41 * 8);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_448 = (ulong *)0x0;
            uStack_440 = 0;
            lVar41 = 0;
            do {
              *(undefined4 *)((long)&local_448 + lVar41 * 4) =
                   *(undefined4 *)(local_208 + lVar41 * 8);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            lVar41 = 0;
            do {
              *(undefined8 *)(local_5a8 + lVar41 * 8) = 1;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_4f8.m_data[0] = 0.0;
            local_4f8.m_data[1] = 0.0;
            local_4f8.m_data[2] = 0.0;
            local_4f8.m_data[3] = 0.0;
            lVar41 = 0;
            do {
              local_4f8.m_data[lVar41] = (float)((&local_5e8.order)[lVar41] - A);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_5f8 = 0;
            TStack_5f0.order = R;
            TStack_5f0.type = SNORM_INT8;
            local_608._0_4_ = R;
            local_608._4_4_ = SNORM_INT8;
            TStack_600.order = R;
            TStack_600.type = SNORM_INT8;
            lVar41 = 0;
            do {
              *(long *)(local_608 + lVar41 * 8) = (long)(int)local_4f8.m_data[lVar41];
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_388._16_8_ = (pointer)0x0;
            TStack_370.order = R;
            TStack_370.type = SNORM_INT8;
            local_388._0_4_ = R;
            local_388._4_4_ = SNORM_INT8;
            local_388._8_8_ = (pointer)0x0;
            lVar41 = 0;
            do {
              *(long *)(local_388 + lVar41 * 8) =
                   *(long *)(local_5a8 + lVar41 * 8) << (local_608[lVar41 * 8] & 0x3f);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_1f8[0] = 0.0;
            local_1f8[1] = 0.0;
            aiStack_1f0[0] = 0;
            aiStack_1f0[1] = 0;
            local_208._0_4_ = R;
            local_208._4_4_ = SNORM_INT8;
            TStack_200.order = R;
            TStack_200.type = SNORM_INT8;
            lVar41 = 0;
            do {
              *(long *)(local_208 + lVar41 * 8) = *(long *)(local_388 + lVar41 * 8) + -1;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            _local_538 = (float  [4])ZEXT816(0);
            lVar41 = 0;
            do {
              *(undefined4 *)(local_538 + lVar41 * 4) = *(undefined4 *)(local_208 + lVar41 * 8);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_388._0_4_ = R;
            local_388._4_4_ = SNORM_INT8;
            local_388._8_8_ = (pointer)0x0;
            lVar41 = 0;
            do {
              iVar13 = *(int *)((long)&local_448 + lVar41 * 4);
              if (iVar13 < *(int *)(local_5c8 + lVar41 * 4)) {
                iVar13 = *(int *)(local_5c8 + lVar41 * 4);
              }
              *(int *)(local_388 + lVar41 * 4) = iVar13;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_208._0_4_ = R;
            local_208._4_4_ = SNORM_INT8;
            TStack_200.order = R;
            TStack_200.type = SNORM_INT8;
            pTVar23 = (TextureFormat *)local_5c8;
            lVar41 = 0;
            pTVar33 = (TextureFormat *)local_388;
            do {
              pTVar46 = pTVar33;
              if (*(char *)((long)local_498 + lVar41) != '\0') {
                pTVar46 = pTVar23;
              }
              *(ChannelOrder *)(local_208 + lVar41 * 4) = pTVar46->order;
              lVar41 = lVar41 + 1;
              pTVar33 = (TextureFormat *)&pTVar33->type;
              pTVar23 = (TextureFormat *)&pTVar23->type;
            } while (lVar41 != 4);
            TStack_5c0.order = TStack_200.order;
            TStack_5c0.type = TStack_200.type;
            local_5c8._0_4_ = local_208._0_4_;
            local_5c8._4_4_ = local_208._4_4_;
            local_388._0_4_ = R;
            local_388._4_4_ = SNORM_INT8;
            local_388._8_4_ = R;
            local_388._12_4_ = SNORM_INT8;
            lVar41 = 0;
            do {
              CVar40 = *(ChannelOrder *)(local_538 + lVar41 * 4);
              if ((int)(&local_468.order)[lVar41] < (int)*(ChannelOrder *)(local_538 + lVar41 * 4))
              {
                CVar40 = (&local_468.order)[lVar41];
              }
              *(ChannelOrder *)(local_388 + lVar41 * 4) = CVar40;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_208._0_4_ = R;
            local_208._4_4_ = SNORM_INT8;
            TStack_200.order = R;
            TStack_200.type = SNORM_INT8;
            pTVar23 = &local_468;
            lVar41 = 0;
            pTVar33 = (TextureFormat *)local_388;
            do {
              pTVar46 = pTVar33;
              if (*(char *)((long)local_498 + lVar41) != '\0') {
                pTVar46 = pTVar23;
              }
              *(ChannelOrder *)(local_208 + lVar41 * 4) = pTVar46->order;
              lVar41 = lVar41 + 1;
              pTVar33 = (TextureFormat *)&pTVar33->type;
              pTVar23 = (TextureFormat *)&pTVar23->type;
            } while (lVar41 != 4);
            local_468.order = local_208._0_4_;
            local_468.type = local_208._4_4_;
            TStack_460 = TStack_200;
          }
          local_208 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_200,"out",3);
          std::ostream::operator<<(&TStack_200,(int)local_558);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&TStack_200," value range: ",0xe);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,"(",1);
          lVar41 = 0;
          do {
            if (lVar41 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,", ",2);
            }
            if (lVar41 < (long)local_500) {
              poVar21 = (ostream *)
                        std::ostream::operator<<
                                  ((TextureFormat *)local_388,*(int *)(local_5c8 + lVar41 * 4));
              std::__ostream_insert<char,std::char_traits<char>>(poVar21," -> ",4);
              std::ostream::operator<<(poVar21,(&local_468.order)[lVar41]);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,"Undef",5);
            }
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,")",1);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
          std::ios_base::~ios_base(local_318);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&TStack_200,(char *)local_5a8,(long)TStack_5a0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_5a8 != (undefined1  [8])&local_598) {
            operator_delete((void *)local_5a8,local_598 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_200);
          std::ios_base::~ios_base(local_190);
          local_388._4_4_ = (ChannelType)local_410;
          local_388._0_4_ = local_574;
          local_388._12_4_ = (ChannelType)local_410;
          local_388._8_4_ = local_574;
          local_208._0_4_ = R;
          local_208._4_4_ = SNORM_INT8;
          TStack_200.order = R;
          TStack_200.type = SNORM_INT8;
          lVar41 = 0;
          do {
            *(int *)(local_208 + lVar41 * 4) = *(int *)(local_388 + lVar41 * 4) + -1;
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          uVar51 = (uint)local_558;
          uVar16 = uVar51 + 7;
          if (-1 < (int)uVar51) {
            uVar16 = uVar51;
          }
          lVar41 = (long)(int)(uVar51 - (uVar16 & 0xfffffff8)) * 0x10;
          iVar13 = *(int *)(s_swizzles + lVar41 + 0xc);
          local_4a8._0_8_ = (long)*(int *)(s_swizzles + lVar41);
          local_570 = (pointer)(long)*(int *)(s_swizzles + lVar41 + 4);
          local_550 = (long)*(int *)(s_swizzles + lVar41 + 8);
          local_448 = (ulong *)CONCAT44(*(undefined4 *)
                                         (local_208 + (long)*(int *)(s_swizzles + lVar41 + 4) * 4),
                                        *(undefined4 *)
                                         (local_208 + (long)*(int *)(s_swizzles + lVar41) * 4));
          uStack_440 = CONCAT44(*(undefined4 *)(local_208 + (long)iVar13 * 4),
                                *(undefined4 *)
                                 (local_208 + (long)*(int *)(s_swizzles + lVar41 + 8) * 4));
          local_598 = 0;
          TStack_590.order = R;
          TStack_590.type = SNORM_INT8;
          local_5a8._0_4_ = R;
          local_5a8._4_4_ = SNORM_INT8;
          TStack_5a0.order = R;
          TStack_5a0.type = SNORM_INT8;
          lVar41 = 0;
          do {
            *(long *)(local_5a8 + lVar41 * 8) = (long)(int)(&local_468.order)[lVar41];
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          local_5f8 = 0;
          TStack_5f0.order = R;
          TStack_5f0.type = SNORM_INT8;
          local_608._0_4_ = R;
          local_608._4_4_ = SNORM_INT8;
          TStack_600.order = 0;
          TStack_600.type = 0;
          lVar41 = 0;
          do {
            *(long *)(local_608 + lVar41 * 8) = (long)*(int *)(local_5c8 + lVar41 * 4);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          local_388._16_8_ = (pointer)0x0;
          TStack_370.order = R;
          TStack_370.type = SNORM_INT8;
          local_388._0_4_ = R;
          local_388._4_4_ = SNORM_INT8;
          local_388._8_8_ = (pointer)0x0;
          lVar41 = 0;
          do {
            *(long *)(local_388 + lVar41 * 8) =
                 *(long *)(local_5a8 + lVar41 * 8) - *(long *)(local_608 + lVar41 * 8);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          local_5d8 = 0;
          TStack_5d0.order = R;
          TStack_5d0.type = SNORM_INT8;
          local_5e8.order = R;
          local_5e8.type = SNORM_INT8;
          TStack_5e0.order = R;
          TStack_5e0.type = SNORM_INT8;
          lVar41 = 0;
          do {
            (&local_5e8)[lVar41] = (TextureFormat)(long)*(int *)((long)&local_448 + lVar41 * 4);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          local_1f8[0] = 0.0;
          local_1f8[1] = 0.0;
          aiStack_1f0[0] = 0;
          aiStack_1f0[1] = 0;
          local_208._0_4_ = R;
          local_208._4_4_ = SNORM_INT8;
          TStack_200.order = R;
          TStack_200.type = SNORM_INT8;
          lVar41 = 0;
          do {
            *(long *)(local_208 + lVar41 * 8) =
                 *(long *)(local_388 + lVar41 * 8) / (long)(&local_5e8)[lVar41];
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          _local_538 = (float  [4])ZEXT816(0);
          lVar41 = 0;
          do {
            *(undefined4 *)(local_538 + lVar41 * 4) = *(undefined4 *)(local_208 + lVar41 * 8);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          puVar42 = (&((local_3b8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start)[local_470];
          lVar41 = local_568._0_8_;
          CVar52 = SNORM_INT8;
          do {
            iVar60 = local_544 * CVar52;
            CVar55 = (int)uVar44 - CVar52;
            unaff_R13 = (pointer)(ulong)CVar55;
            lVar58 = 0;
            do {
              local_608._0_4_ = (undefined4)lVar58;
              local_608._4_4_ = CVar52;
              TStack_600.type = CVar55;
              TStack_600.order = (int)local_540 - local_608._0_4_;
              local_5a8._0_4_ = *(ChannelOrder *)(local_608 + local_4a8._0_8_ * 4);
              local_5a8._4_4_ = *(ChannelType *)(local_608 + (long)local_570 * 4);
              TStack_5a0.order = *(ChannelOrder *)(local_608 + local_550 * 4);
              TStack_5a0.type = *(ChannelType *)(local_608 + (long)iVar13 * 4);
              local_388._0_4_ = R;
              local_388._4_4_ = SNORM_INT8;
              local_388._8_4_ = R;
              local_388._12_4_ = SNORM_INT8;
              lVar22 = 0;
              do {
                *(int *)(local_388 + lVar22 * 4) =
                     *(int *)(local_5a8 + lVar22 * 4) * *(int *)(local_538 + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              local_208._0_4_ = R;
              local_208._4_4_ = SNORM_INT8;
              TStack_200.order = R;
              TStack_200.type = SNORM_INT8;
              lVar22 = 0;
              do {
                *(int *)(local_208 + lVar22 * 4) =
                     *(int *)(local_388 + lVar22 * 4) + *(int *)(local_5c8 + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              if (0 < (int)uVar37) {
                memcpy(puVar42 + (int)(uVar37 * local_608._0_4_ + iVar60),local_208,local_4d8._0_8_)
                ;
                lVar41 = local_568._0_8_;
              }
              lVar58 = lVar58 + 1;
            } while (lVar58 != lVar41);
            bVar12 = (ChannelType)local_510 != CVar52;
            uVar44 = local_510;
            pFVar32 = local_3f8;
            CVar52 = CVar52 + SNORM_INT16;
          } while (bVar12);
        }
        else {
          unaff_R13 = local_50;
          if ((uint)local_50 < 4) {
            if (getUintRange(glu::Precision)::ranges == '\0') {
              iterate();
            }
            CVar10 = local_574;
            CVar40 = *(ChannelOrder *)(getUintRange(glu::Precision)::ranges + uVar61 * 8 + 4);
            lVar41 = 0;
            do {
              (&local_5e8.order)[lVar41] = CVar40;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            iVar13 = pFVar32->location + (uint)local_580;
            if ((-1 < iVar13) &&
               (iVar13 < (int)((ulong)((long)local_4c8.
                                             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_4c8.
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x33333333)) {
              tcu::getTextureFormatBitDepth
                        ((tcu *)local_5c8,
                         &local_4c8.
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [(int)(pFVar32->location + (uint)local_580)].format);
              lVar41 = 0;
              do {
                *(undefined8 *)(local_5a8 + lVar41 * 8) = 1;
                lVar41 = lVar41 + 1;
              } while (lVar41 != 4);
              local_5f8 = 0;
              TStack_5f0.order = R;
              TStack_5f0.type = SNORM_INT8;
              local_608._0_4_ = R;
              local_608._4_4_ = SNORM_INT8;
              TStack_600.order = R;
              TStack_600.type = SNORM_INT8;
              lVar41 = 0;
              do {
                *(long *)(local_608 + lVar41 * 8) = (long)*(int *)(local_5c8 + lVar41 * 4);
                lVar41 = lVar41 + 1;
              } while (lVar41 != 4);
              local_388._16_8_ = (pointer)0x0;
              TStack_370.order = R;
              TStack_370.type = SNORM_INT8;
              local_388._0_4_ = R;
              local_388._4_4_ = SNORM_INT8;
              local_388._8_4_ = R;
              local_388._12_4_ = SNORM_INT8;
              lVar41 = 0;
              do {
                *(long *)(local_388 + lVar41 * 8) =
                     *(long *)(local_5a8 + lVar41 * 8) << (local_608[lVar41 * 8] & 0x3f);
                lVar41 = lVar41 + 1;
              } while (lVar41 != 4);
              local_1f8[0] = 0.0;
              local_1f8[1] = 0.0;
              aiStack_1f0[0] = 0;
              aiStack_1f0[1] = 0;
              local_208._0_4_ = R;
              local_208._4_4_ = SNORM_INT8;
              TStack_200.order = R;
              TStack_200.type = SNORM_INT8;
              lVar41 = 0;
              do {
                *(long *)(local_208 + lVar41 * 8) = *(long *)(local_388 + lVar41 * 8) + -1;
                lVar41 = lVar41 + 1;
              } while (lVar41 != 4);
              local_468.order = R;
              local_468.type = SNORM_INT8;
              TStack_460.order = R;
              TStack_460.type = SNORM_INT8;
              lVar41 = 0;
              do {
                (&local_468.order)[lVar41] = *(ChannelOrder *)(local_208 + lVar41 * 8);
                lVar41 = lVar41 + 1;
              } while (lVar41 != 4);
              local_208._0_4_ = R;
              local_208._4_4_ = SNORM_INT8;
              TStack_200.order = R;
              TStack_200.type = SNORM_INT8;
              lVar41 = 0;
              do {
                CVar40 = (&local_468.order)[lVar41];
                if ((&local_5e8.order)[lVar41] < (&local_468.order)[lVar41]) {
                  CVar40 = (&local_5e8.order)[lVar41];
                }
                *(ChannelOrder *)(local_208 + lVar41 * 4) = CVar40;
                lVar41 = lVar41 + 1;
              } while (lVar41 != 4);
              local_5e8.order = local_208._0_4_;
              local_5e8.type = local_208._4_4_;
              TStack_5e0 = TStack_200;
            }
            local_208 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_200);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_200,"out",3);
            std::ostream::operator<<(&TStack_200,(int)local_558);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&TStack_200," value range: ",0xe);
            local_608._0_4_ = R;
            local_608._4_4_ = SNORM_INT8;
            TStack_600.order = 0;
            TStack_600.type = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,"(",1);
            lVar41 = 0;
            do {
              if (lVar41 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,", ",2);
              }
              if (lVar41 < (long)local_500) {
                poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)local_388);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21," -> ",4);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,"Undef",5);
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388,")",1);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
            std::ios_base::~ios_base(local_318);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&TStack_200,(char *)local_5a8,(long)TStack_5a0);
            lVar41 = local_470;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_5a8 != (undefined1  [8])&local_598) {
              operator_delete((void *)local_5a8,local_598 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_200);
            std::ios_base::~ios_base(local_190);
            local_388._4_4_ = (ChannelType)local_410;
            local_388._0_4_ = CVar10;
            local_388._12_4_ = (ChannelType)local_410;
            local_388._8_4_ = CVar10;
            local_208._0_4_ = R;
            local_208._4_4_ = SNORM_INT8;
            TStack_200.order = R;
            TStack_200.type = SNORM_INT8;
            lVar58 = 0;
            do {
              *(int *)(local_208 + lVar58 * 4) = *(int *)(local_388 + lVar58 * 4) + -1;
              lVar58 = lVar58 + 1;
            } while (lVar58 != 4);
            uVar51 = (uint)local_558;
            uVar16 = uVar51 + 7;
            if (-1 < (int)uVar51) {
              uVar16 = uVar51;
            }
            lVar58 = (long)(int)(uVar51 - (uVar16 & 0xfffffff8)) * 0x10;
            iVar13 = *(int *)(s_swizzles + lVar58 + 0xc);
            local_4a8._0_8_ = (long)*(int *)(s_swizzles + lVar58);
            local_570 = (pointer)(long)*(int *)(s_swizzles + lVar58 + 4);
            local_550 = (long)*(int *)(s_swizzles + lVar58 + 8);
            local_388._4_4_ =
                 *(ChannelType *)(local_208 + (long)*(int *)(s_swizzles + lVar58 + 4) * 4);
            local_388._0_4_ = *(ChannelOrder *)(local_208 + (long)*(int *)(s_swizzles + lVar58) * 4)
            ;
            local_388._12_4_ = *(int *)(local_208 + (long)iVar13 * 4);
            local_388._8_4_ = *(int *)(local_208 + (long)*(int *)(s_swizzles + lVar58 + 8) * 4);
            local_208._0_4_ = R;
            local_208._4_4_ = SNORM_INT8;
            TStack_200.order = R;
            TStack_200.type = SNORM_INT8;
            lVar58 = 0;
            do {
              *(uint *)(local_208 + lVar58 * 4) =
                   (&local_5e8.order)[lVar58] / *(uint *)(local_388 + lVar58 * 4);
              lVar58 = lVar58 + 1;
            } while (lVar58 != 4);
            unaff_R13 = (pointer)(&((local_3b8.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start)[lVar41];
            lVar41 = local_568._0_8_;
            CVar52 = SNORM_INT8;
            do {
              iVar60 = local_544 * CVar52;
              iVar15 = (int)local_510;
              lVar58 = 0;
              do {
                local_608._0_4_ = (undefined4)lVar58;
                local_608._4_4_ = CVar52;
                TStack_600.type = iVar15 - CVar52;
                TStack_600.order = (int)local_540 - local_608._0_4_;
                local_5a8._0_4_ = *(ChannelOrder *)(local_608 + local_4a8._0_8_ * 4);
                local_5a8._4_4_ = *(ChannelType *)(local_608 + (long)local_570 * 4);
                TStack_5a0.order = *(ChannelOrder *)(local_608 + local_550 * 4);
                TStack_5a0.type = *(ChannelType *)(local_608 + (long)iVar13 * 4);
                local_388._0_4_ = R;
                local_388._4_4_ = SNORM_INT8;
                local_388._8_4_ = R;
                local_388._12_4_ = SNORM_INT8;
                lVar22 = 0;
                do {
                  *(int *)(local_388 + lVar22 * 4) =
                       *(int *)(local_5a8 + lVar22 * 4) * *(int *)(local_208 + lVar22 * 4);
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 4);
                if (0 < (int)uVar37) {
                  memcpy((undefined1 *)
                         ((long)&(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &unaff_R13->format)->_M_impl).super__Vector_impl_data._M_start +
                         (long)(int)(uVar37 * local_608._0_4_ + iVar60) * 4),local_388,
                         local_4d8._0_8_);
                  lVar41 = local_568._0_8_;
                }
                lVar58 = lVar58 + 1;
              } while (lVar58 != lVar41);
              bVar12 = (ChannelType)local_510 != CVar52;
              uVar44 = local_510;
              pFVar32 = local_3f8;
              CVar52 = CVar52 + SNORM_INT16;
            } while (bVar12);
          }
        }
        pFVar59 = (pointer)(ulong)((int)local_558 + 1);
        iVar13 = (uint)local_580 + 1;
        local_580 = CONCAT44(local_580._4_4_,iVar13);
      } while (iVar13 != (int)local_3f0);
      lVar41 = local_58 + 1;
      pFVar32 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar41 < (int)((ulong)((long)(this->m_outputs).
                                          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar32
                                   ) >> 4));
  }
  lVar41 = local_480;
  (**(code **)(local_480 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar41 + 0x78))(0x8d40,this->m_framebuffer);
  (**(code **)(lVar41 + 0x1a00))(0,0,local_400,local_408);
  (**(code **)(lVar41 + 0x560))
            ((ulong)((long)local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  (**(code **)(lVar41 + 0x4e8))(0xbd0);
  dVar17 = (**(code **)(lVar41 + 0x800))();
  glu::checkError(dVar17,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x303);
  pFVar32 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar32) >> 4)) {
    unaff_R13 = (pointer)0x0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_568._8_8_;
    local_568 = auVar9 << 0x40;
    do {
      DVar2 = pFVar32[(long)unaff_R13].type;
      iVar13 = pFVar32[(long)unaff_R13].arrayLength;
      local_550 = CONCAT71(local_550._1_7_,0 < iVar13);
      iVar60 = glu::getDataTypeScalarSize(DVar2);
      lVar41 = local_480;
      local_4d8._0_4_ = iVar60;
      uVar38 = 0;
      if (DVar2 - TYPE_UINT < 4) {
        uVar38 = 0x1405;
      }
      if (DVar2 - TYPE_INT < 4) {
        uVar38 = 0x1404;
      }
      local_4a8._0_4_ = DVar2 - TYPE_FLOAT;
      if (DVar2 - TYPE_FLOAT < 4) {
        uVar38 = 0x1406;
      }
      local_570 = (pointer)CONCAT44(local_570._4_4_,uVar38);
      iVar60 = 1;
      if (0 < iVar13) {
        iVar60 = pFVar32[(long)unaff_R13].arrayLength;
      }
      if (0 < iVar60) {
        iVar15 = 0;
        do {
          local_608 = (undefined1  [8])&local_5f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"in","");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
          std::ostream::operator<<((MessageBuilder *)local_208,(int)unaff_R13);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
          std::ios_base::~ios_base(local_198);
          uVar44 = 0xf;
          if (local_608 != (undefined1  [8])&local_5f8) {
            uVar44 = local_5f8;
          }
          if (uVar44 < (ulong)((long)TStack_5e0 + (long)TStack_600)) {
            uVar44 = 0xf;
            if (local_5e8 != (TextureFormat)&local_5d8) {
              uVar44 = local_5d8;
            }
            if (uVar44 < (ulong)((long)TStack_5e0 + (long)TStack_600)) goto LAB_012e1943;
            pTVar23 = (TextureFormat *)
                      std::__cxx11::string::replace
                                ((ulong)&local_5e8,0,(char *)0x0,(ulong)local_608);
          }
          else {
LAB_012e1943:
            pTVar23 = (TextureFormat *)std::__cxx11::string::_M_append(local_608,(ulong)local_5e8);
          }
          local_5a8 = (undefined1  [8])&local_598;
          TVar62 = (TextureFormat)(pTVar23 + 2);
          if (*pTVar23 == TVar62) {
            local_598 = *(ulong *)TVar62;
            TStack_590 = pTVar23[3];
          }
          else {
            local_598 = *(ulong *)TVar62;
            local_5a8 = (undefined1  [8])*pTVar23;
          }
          TStack_5a0 = pTVar23[1];
          *pTVar23 = TVar62;
          pTVar23[1].order = R;
          pTVar23[1].type = SNORM_INT8;
          *(undefined1 *)TVar62 = 0;
          if (iVar13 < 1) {
            puVar34 = &local_5b8;
            local_5c8 = (undefined1  [8])puVar34;
            puVar39 = (undefined8 *)(local_5c8 + 8);
          }
          else {
            local_468 = (TextureFormat)local_458;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"_","");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            std::ostream::operator<<((MessageBuilder *)local_208,iVar15);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
            uVar44 = 0xf;
            if (local_468 != (TextureFormat)local_458) {
              uVar44 = local_458[0];
            }
            if (uVar44 < (ulong)(uStack_440 + (long)TStack_460)) {
              uVar44 = 0xf;
              if (local_448 != local_438) {
                uVar44 = local_438[0];
              }
              if (uVar44 < (ulong)(uStack_440 + (long)TStack_460)) goto LAB_012e1a8e;
              puVar24 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_448,0,(char *)0x0,(ulong)local_468);
            }
            else {
LAB_012e1a8e:
              puVar24 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_448);
            }
            local_5c8 = (undefined1  [8])&local_5b8;
            puVar34 = puVar24 + 2;
            if ((ulong *)*puVar24 == puVar34) {
              local_5b8 = *puVar34;
              uStack_5b0 = puVar24[3];
            }
            else {
              local_5b8 = *puVar34;
              local_5c8 = (undefined1  [8])*puVar24;
            }
            puVar39 = puVar24 + 1;
            TStack_5c0 = (TextureFormat)puVar24[1];
            *puVar24 = puVar34;
          }
          *puVar39 = 0;
          *(undefined1 *)puVar34 = 0;
          uVar44 = 0xf;
          if (local_5a8 != (undefined1  [8])&local_598) {
            uVar44 = local_598;
          }
          if (uVar44 < (ulong)((long)TStack_5c0 + (long)TStack_5a0)) {
            uVar44 = 0xf;
            if (local_5c8 != (undefined1  [8])&local_5b8) {
              uVar44 = local_5b8;
            }
            if (uVar44 < (ulong)((long)TStack_5c0 + (long)TStack_5a0)) goto LAB_012e1b62;
            pTVar23 = (TextureFormat *)
                      std::__cxx11::string::replace((ulong)local_5c8,0,(char *)0x0,(ulong)local_5a8)
            ;
          }
          else {
LAB_012e1b62:
            pTVar23 = (TextureFormat *)std::__cxx11::string::_M_append(local_5a8,(ulong)local_5c8);
          }
          local_388._0_8_ = (long)local_388 + 0x10;
          TVar62 = (TextureFormat)(pTVar23 + 2);
          if (*pTVar23 == TVar62) {
            local_388._16_8_ = *(undefined8 *)TVar62;
            TStack_370 = pTVar23[3];
          }
          else {
            local_388._16_8_ = *(undefined8 *)TVar62;
            local_388._0_8_ = *pTVar23;
          }
          local_388._8_8_ = pTVar23[1];
          *pTVar23 = TVar62;
          pTVar23[1].order = R;
          pTVar23[1].type = SNORM_INT8;
          *(undefined1 *)TVar62 = 0;
          if (local_5c8 != (undefined1  [8])&local_5b8) {
            operator_delete((void *)local_5c8,local_5b8 + 1);
          }
          if (0 < iVar13) {
            if (local_448 != local_438) {
              operator_delete(local_448,local_438[0] + 1);
            }
            if (local_468 != (TextureFormat)local_458) {
              operator_delete((void *)local_468,local_458[0] + 1);
            }
          }
          if (local_5a8 != (undefined1  [8])&local_598) {
            operator_delete((void *)local_5a8,local_598 + 1);
          }
          if (local_5e8 != (TextureFormat)&local_5d8) {
            operator_delete((void *)local_5e8,local_5d8 + 1);
          }
          if (local_608 != (undefined1  [8])&local_5f8) {
            operator_delete((void *)local_608,local_5f8 + 1);
          }
          iVar57 = (**(code **)(lVar41 + 0x780))
                             ((this->m_program->m_program).m_program,local_388._0_8_);
          if (iVar57 < 0) {
            local_208._0_4_ = local_478.order;
            local_208._4_4_ = local_478.type;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&TStack_200,"Warning: No location for attribute \'",0x24);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&TStack_200,(char *)local_388._0_8_,local_388._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_200,"\' found.",8)
            ;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_200);
            std::ios_base::~ios_base(local_190);
          }
          else {
            (**(code **)(lVar41 + 0x610))(iVar57);
            if ((uint)local_4a8._0_4_ < 4) {
              (**(code **)(lVar41 + 0x19f0))
                        (iVar57,local_4d8._0_4_,(ulong)local_570 & 0xffffffff,0,0);
            }
            else {
              (**(code **)(lVar41 + 0x1958))
                        (iVar57,local_4d8._0_4_,(ulong)local_570 & 0xffffffff,0,
                         local_3b8.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_568._0_4_ + iVar15].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
            }
          }
          if (local_388._0_8_ != (long)local_388 + 0x10) {
            operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
          }
          auVar9 = local_568;
          iVar15 = iVar15 + 1;
        } while (iVar60 != iVar15);
        iVar13 = local_568._0_4_;
        local_568._4_4_ = 0;
        local_568._0_4_ = iVar13 + iVar15;
        local_568._8_8_ = auVar9._8_8_;
      }
      unaff_R13 = (pointer)((long)&(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &unaff_R13->format)->_M_impl).super__Vector_impl_data._M_start +
                           1);
      pFVar32 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)unaff_R13 <
             (long)(int)((ulong)((long)(this->m_outputs).
                                       super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar32)
                        >> 4));
  }
  lVar41 = local_480;
  iVar13 = (**(code **)(local_480 + 0x780))((this->m_program->m_program).m_program);
  uVar44 = local_488;
  if (iVar13 < 0) {
    pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar29,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x32a);
    __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar41 + 0x610))(iVar13);
  (**(code **)(lVar41 + 0x19f0))
            (iVar13,4,0x1406,0,0,
             local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar17 = (**(code **)(lVar41 + 0x800))();
  glu::checkError(dVar17,"After attribute setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x32e);
  (**(code **)(lVar41 + 0x568))
            (4,local_3e0,0x1403,
             local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar17 = (**(code **)(lVar41 + 0x800))();
  glu::checkError(dVar17,"glDrawElements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x331);
  if (0 < (int)uVar44) {
    local_570 = (pointer)(ulong)((uint)local_488 & 0x7fffffff);
    puVar42 = (pointer)0x0;
    local_4a8._0_8_ =
         local_4c8.
         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pAVar56 = local_4c8.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      TVar25 = glu::getTransferFormat(pAVar56[(long)puVar42].readFormat);
      local_4d8._0_8_ =
           pAVar56[(long)puVar42].renderedData.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      pBVar19 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar13 = pBVar19[(long)puVar42].width;
      local_568._0_4_ = pBVar19[(long)puVar42].height;
      uVar37 = pAVar56[(long)puVar42].numWrittenChannels;
      iVar60 = tcu::TextureFormat::getPixelSize(&pAVar56[(long)puVar42].readFormat);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_208,&pAVar56[(long)puVar42].readFormat,iVar13,
                 local_568._0_4_,1,iVar60 * iVar13 + 3U & 0xfffffffc,0,
                 pAVar56[(long)puVar42].renderedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(local_480 + 0x1218))((int)puVar42 + 0x8ce0);
      (**(code **)(local_480 + 0x1220))
                (0,0,local_400,local_408,(ulong)TVar25 & 0xffffffff,(ulong)TVar25 >> 0x20,
                 local_4d8._0_8_);
      if (0 < (int)TStack_200.type) {
        iVar13 = 0;
        do {
          if (0 < (int)TStack_200.order) {
            iVar60 = 0;
            do {
              TVar14 = tcu::getTextureChannelClass(local_208._4_4_);
              iVar15 = (int)(TextureFormat *)local_208;
              if (TVar14 < TEXTURECHANNELCLASS_FLOATING_POINT) {
                tcu::getTextureFormatBitDepth((tcu *)local_388,(TextureFormat *)local_208);
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_5a8,iVar15,iVar60,iVar13);
                local_608._0_4_ = R;
                local_608._4_4_ = SNORM_INT8;
                TStack_600 = (TextureFormat)((ulong)(uint)~(-1 << (local_388[0xc] & 0x1f)) << 0x20);
                if (0 < (int)uVar37) {
                  memcpy((IVec4 *)local_608,local_5a8,(ulong)uVar37 * 4);
                }
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_208,(IVec4 *)local_608,iVar60,iVar13,0);
              }
              else if (TVar14 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_388,iVar15,iVar60,iVar13);
                local_5a8 = (undefined1  [8])0;
                TStack_5a0.order = R;
                TStack_5a0.type = 0x3f800000;
                if (0 < (int)uVar37) {
                  memcpy((Vec4 *)local_5a8,local_388,(ulong)uVar37 * 4);
                }
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_208,(Vec4 *)local_5a8,iVar60,iVar13,0);
              }
              iVar60 = iVar60 + 1;
            } while (iVar60 < (int)TStack_200.order);
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)TStack_200.type);
      }
      puVar42 = (pointer)((long)puVar42 + 1);
      unaff_R13 = (pointer)local_4a8._0_8_;
      pAVar56 = (pointer)local_4a8._0_8_;
    } while (puVar42 != local_570);
  }
  pFVar32 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar32) >> 4)) {
    local_3e8 = local_4c8.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_540 = (ulong)((int)local_540 - 1);
    local_510 = (ulong)((int)local_510 - 1);
    lVar41 = 0;
    local_500 = local_500 & 0xffffffff00000000;
    do {
      local_580 = (ulong)pFVar32[lVar41].type;
      iVar13 = pFVar32[lVar41].arrayLength;
      local_3f0 = lVar41;
      iVar15 = glu::getDataTypeScalarSize(pFVar32[lVar41].type);
      iVar60 = 1;
      if (0 < iVar13) {
        iVar60 = pFVar32[lVar41].arrayLength;
      }
      iVar13 = (int)local_500;
      if (0 < iVar60) {
        local_4dc = (int)local_580 - 1;
        local_580 = (ulong)((int)local_580 - 0x1b);
        iVar57 = 0;
        local_470 = CONCAT44(local_470._4_4_,iVar60);
        local_558 = pFVar32 + lVar41;
        do {
          iVar60 = local_558->location + iVar57;
          local_500 = CONCAT44(local_500._4_4_,iVar13);
          puVar42 = local_3b8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar13].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pBVar19 = (this->m_fboSpec).
                    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_544 = iVar57;
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_208,&local_3e8[iVar60].referenceFormat,
                     pBVar19[iVar60].width,pBVar19[iVar60].height,1,
                     local_3e8[iVar60].referenceData.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          tcu::getSubregion((PixelBufferAccess *)local_388,(PixelBufferAccess *)local_208,0,0,0,
                            (int)local_400,(int)local_408,1);
          if ((uint)local_580 < 8) {
            if (0 < (int)local_388._12_4_) {
              fVar64 = (float)(int)local_388._8_4_ / local_504;
              local_568._0_4_ = (float)(int)local_388._12_4_ / local_508;
              iVar13 = 0;
              do {
                if (0 < (int)local_388._8_4_) {
                  fVar65 = floorf((float)iVar13 / (float)local_568._0_4_);
                  iVar57 = (int)fVar65;
                  iVar60 = (int)local_510;
                  if (iVar57 < (int)local_510) {
                    iVar60 = iVar57;
                  }
                  iVar53 = 0;
                  if (iVar57 < 0) {
                    iVar60 = 0;
                  }
                  iVar60 = iVar60 * local_574;
                  do {
                    fVar65 = floorf((float)iVar53 / fVar64);
                    iVar30 = (int)fVar65;
                    iVar57 = iVar30;
                    if ((int)local_540 <= iVar30) {
                      iVar57 = (int)local_540;
                    }
                    local_5a8._4_4_ = SNORM_INT8;
                    iVar31 = 0;
                    if (-1 < iVar30) {
                      iVar31 = iVar57;
                    }
                    lVar41 = (long)((iVar31 + iVar60 + 1) * iVar15);
                    if (1 < iVar15) {
                      local_5a8._4_4_ = puVar42[lVar41 + 1];
                    }
                    TStack_5a0.type = SNORM_INT8;
                    TStack_5a0.order = R;
                    if (2 < iVar15) {
                      TStack_5a0.order = puVar42[lVar41 + 2];
                    }
                    if (3 < iVar15) {
                      TStack_5a0.type = puVar42[lVar41 + 3];
                    }
                    local_5a8._0_4_ = puVar42[lVar41];
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)local_388,(IVec4 *)local_5a8,iVar53,iVar13,0);
                    iVar53 = iVar53 + 1;
                  } while (iVar53 < (int)local_388._8_4_);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 < (int)local_388._12_4_);
            }
          }
          else if (local_4dc < 4) {
            bVar12 = tcu::isSRGB((TextureFormat)local_388._0_8_);
            local_570 = (pointer)CONCAT71(local_570._1_7_,bVar12);
            if (0 < (int)local_388._12_4_) {
              fVar64 = (float)(int)local_388._8_4_ / local_504;
              local_550 = CONCAT44(local_550._4_4_,(float)(int)local_388._12_4_ / local_508);
              iVar13 = 0;
              do {
                if (0 < (int)local_388._8_4_) {
                  local_568 = ZEXT416((uint)(float)iVar13);
                  fVar65 = floorf((float)iVar13 / (float)local_550);
                  iVar57 = (int)fVar65;
                  iVar60 = (int)local_510;
                  if (iVar57 < (int)local_510) {
                    iVar60 = iVar57;
                  }
                  iVar53 = 0;
                  if (iVar57 < 0) {
                    iVar60 = 0;
                  }
                  local_568._0_4_ =
                       (((float)local_568._0_4_ - (float)iVar60 * (float)local_550) + 0.5) /
                       (float)local_550;
                  iVar57 = iVar60 * local_574;
                  iVar60 = (iVar60 + 1) * local_574;
                  local_4a8 = ZEXT416((uint)(1.0 - (float)local_568._0_4_));
                  do {
                    local_4d8 = ZEXT416((uint)(float)iVar53);
                    fVar65 = floorf((float)iVar53 / fVar64);
                    iVar31 = (int)fVar65;
                    iVar30 = (int)local_540;
                    if (iVar31 < (int)local_540) {
                      iVar30 = iVar31;
                    }
                    if (iVar31 < 0) {
                      iVar30 = 0;
                    }
                    iVar31 = iVar30 + iVar57;
                    lVar41 = (long)(iVar31 * iVar15);
                    TStack_5a0.order = R;
                    local_5a8._4_4_ = SNORM_INT8;
                    if (1 < iVar15) {
                      local_5a8._4_4_ = puVar42[lVar41 + 1];
                    }
                    if (2 < iVar15) {
                      TStack_5a0.order = puVar42[lVar41 + 2];
                    }
                    local_608._4_4_ = SNORM_INT8;
                    TStack_5a0.type = SNORM_INT8;
                    if (3 < iVar15) {
                      TStack_5a0.type = puVar42[lVar41 + 3];
                    }
                    iVar18 = iVar30 + iVar60;
                    local_5a8._0_4_ = puVar42[lVar41];
                    lVar41 = (long)(iVar18 * iVar15);
                    if (1 < iVar15) {
                      local_608._4_4_ = puVar42[lVar41 + 1];
                    }
                    TStack_600.type = SNORM_INT8;
                    TStack_600.order = R;
                    if (2 < iVar15) {
                      TStack_600.order = puVar42[lVar41 + 2];
                    }
                    if (3 < iVar15) {
                      TStack_600.type = puVar42[lVar41 + 3];
                    }
                    local_608._0_4_ = puVar42[lVar41];
                    lVar41 = (long)((iVar31 + 1) * iVar15);
                    TStack_5e0.order = R;
                    local_5e8.type = SNORM_INT8;
                    if (1 < iVar15) {
                      local_5e8.type = puVar42[lVar41 + 1];
                    }
                    if (2 < iVar15) {
                      TStack_5e0.order = puVar42[lVar41 + 2];
                    }
                    local_5c8._4_4_ = SNORM_INT8;
                    TStack_5e0.type = SNORM_INT8;
                    if (3 < iVar15) {
                      TStack_5e0.type = puVar42[lVar41 + 3];
                    }
                    local_5e8.order = puVar42[lVar41];
                    lVar41 = (long)((iVar18 + 1) * iVar15);
                    if (1 < iVar15) {
                      local_5c8._4_4_ = puVar42[lVar41 + 1];
                    }
                    TStack_5c0.type = SNORM_INT8;
                    TStack_5c0.order = 0;
                    if (2 < iVar15) {
                      TStack_5c0.order = puVar42[lVar41 + 2];
                    }
                    if (3 < iVar15) {
                      TStack_5c0.type = puVar42[lVar41 + 3];
                    }
                    fVar66 = (((float)local_4d8._0_4_ - (float)iVar30 * fVar64) + 0.5) / fVar64;
                    local_5c8._0_4_ = puVar42[lVar41];
                    fVar65 = (float)local_568._0_4_ + fVar66;
                    puVar26 = local_5a8;
                    if (1.0 <= fVar65) {
                      puVar26 = local_5c8;
                    }
                    pTVar23 = &local_5e8;
                    if (1.0 <= fVar65) {
                      pTVar23 = (TextureFormat *)local_608;
                    }
                    local_3d8[0] = 0.0;
                    local_3d8[1] = 0.0;
                    local_3d8[2] = 0.0;
                    local_3d8[3] = 0.0;
                    lVar41 = 0;
                    do {
                      local_3d8[lVar41] =
                           (float)(&pTVar23->order)[lVar41] - *(float *)(puVar26 + lVar41 * 4);
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 4);
                    uVar37 = -(uint)(1.0 <= fVar65);
                    local_498[0] = 0;
                    local_498[1] = 0;
                    lVar41 = 0;
                    do {
                      *(float *)((long)local_498 + lVar41 * 4) =
                           local_3d8[lVar41] *
                           (float)(~uVar37 & (uint)fVar66 | (uint)(1.0 - fVar66) & uVar37);
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 4);
                    local_4f8.m_data[0] = 0.0;
                    local_4f8.m_data[1] = 0.0;
                    local_4f8.m_data[2] = 0.0;
                    local_4f8.m_data[3] = 0.0;
                    lVar41 = 0;
                    do {
                      local_4f8.m_data[lVar41] =
                           *(float *)(puVar26 + lVar41 * 4) +
                           *(float *)((long)local_498 + lVar41 * 4);
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 4);
                    pTVar23 = (TextureFormat *)local_608;
                    if (1.0 <= fVar65) {
                      pTVar23 = &local_5e8;
                    }
                    local_48[0] = 0.0;
                    local_48[1] = 0.0;
                    local_48[2] = 0.0;
                    local_48[3] = 0.0;
                    lVar41 = 0;
                    do {
                      local_48[lVar41] =
                           (float)(&pTVar23->order)[lVar41] - *(float *)(puVar26 + lVar41 * 4);
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 4);
                    _local_428 = 0;
                    uStack_420 = 0;
                    lVar41 = 0;
                    do {
                      (&local_428)[lVar41] =
                           local_48[lVar41] *
                           (float)(~uVar37 & local_568._0_4_ | uVar37 & local_4a8._0_4_);
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 4);
                    _local_538 = (float  [4])ZEXT816(0);
                    lVar41 = 0;
                    do {
                      *(float *)(local_538 + lVar41 * 4) =
                           local_4f8.m_data[lVar41] + (float)(&local_428)[lVar41];
                      VVar11.m_data = _local_538;
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 4);
                    if ((char)local_570 == '\0') {
                      local_4f8.m_data[0] = (float)local_538._0_4_;
                      local_4f8.m_data[1] = (float)local_538._4_4_;
                      local_4f8.m_data[2] = (float)local_538._8_4_;
                      local_4f8.m_data[3] = fStack_52c;
                      _local_538 = VVar11.m_data;
                    }
                    else {
                      tcu::linearToSRGB((tcu *)&local_4f8,(Vec4 *)local_538);
                    }
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)local_388,&local_4f8,iVar53,iVar13,0);
                    iVar53 = iVar53 + 1;
                  } while (iVar53 < (int)local_388._8_4_);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 < (int)local_388._12_4_);
            }
          }
          iVar13 = (int)local_500 + 1;
          iVar57 = local_544 + 1;
        } while (iVar57 != (int)local_470);
      }
      unaff_R13 = (pointer)local_388;
      local_500 = CONCAT44(local_500._4_4_,iVar13);
      lVar41 = local_3f0 + 1;
      pFVar32 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar41 < (int)((ulong)((long)(this->m_outputs).
                                          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar32
                                   ) >> 4));
  }
  uVar37 = (uint)local_488;
  if ((int)uVar37 < 1) {
    uVar44 = 1;
  }
  else {
    uVar44 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    uVar61 = 0;
    do {
      uVar4 = _local_428;
      pAVar54 = local_4c8.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_4d8._0_4_ = (int)uVar44;
      pBVar19 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar13 = pBVar19[uVar61].width;
      iVar60 = pBVar19[uVar61].height;
      pAVar56 = local_4c8.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar61;
      iVar15 = local_4c8.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar61].numWrittenChannels;
      local_568._0_4_ = iVar15;
      uStack_424 = SUB84(uVar4,4);
      local_428 = CONCAT13(3 < iVar15,CONCAT12(2 < iVar15,CONCAT11(1 < iVar15,0 < iVar15)));
      local_540 = CONCAT44(local_540._4_4_,
                           local_4c8.
                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar61].outPrecision);
      iVar15 = tcu::TextureFormat::getPixelSize(&pAVar56->readFormat);
      pAVar54 = pAVar54 + uVar61;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_388,&pAVar56->readFormat,iVar13,iVar60,1,
                 iVar15 * iVar13 + 3U & 0xfffffffc,0,
                 (pAVar54->renderedData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_5a8,&pAVar54->referenceFormat,iVar13,iVar60,1,
                 (pAVar54->referenceData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      TVar14 = tcu::getTextureChannelClass((pAVar54->format).type);
      local_5e8 = (TextureFormat)&local_5d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"Attachment","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      iVar13 = (int)uVar61;
      std::ostream::operator<<((MessageBuilder *)local_208,iVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      std::ios_base::~ios_base(local_198);
      uVar44 = 0xf;
      if (local_5e8 != (TextureFormat)&local_5d8) {
        uVar44 = local_5d8;
      }
      if (uVar44 < (ulong)((long)TStack_5c0 + (long)TStack_5e0)) {
        uVar44 = 0xf;
        if (local_5c8 != (undefined1  [8])&local_5b8) {
          uVar44 = local_5b8;
        }
        if (uVar44 < (ulong)((long)TStack_5c0 + (long)TStack_5e0)) goto LAB_012e2b52;
        pTVar23 = (TextureFormat *)
                  std::__cxx11::string::replace((ulong)local_5c8,0,(char *)0x0,(ulong)local_5e8);
      }
      else {
LAB_012e2b52:
        pTVar23 = (TextureFormat *)
                  std::__cxx11::string::_M_append((char *)&local_5e8,(ulong)local_5c8);
      }
      local_608 = (undefined1  [8])&local_5f8;
      TVar62 = (TextureFormat)(pTVar23 + 2);
      if (*pTVar23 == TVar62) {
        local_5f8 = *(ulong *)TVar62;
        TStack_5f0 = pTVar23[3];
      }
      else {
        local_5f8 = *(ulong *)TVar62;
        local_608 = (undefined1  [8])*pTVar23;
      }
      TStack_600 = pTVar23[1];
      *pTVar23 = TVar62;
      pTVar23[1].order = R;
      pTVar23[1].type = SNORM_INT8;
      *(undefined1 *)TVar62 = 0;
      if (local_5c8 != (undefined1  [8])&local_5b8) {
        operator_delete((void *)local_5c8,local_5b8 + 1);
      }
      if (local_5e8 != (TextureFormat)&local_5d8) {
        operator_delete((void *)local_5e8,local_5d8 + 1);
      }
      local_5c8 = (undefined1  [8])&local_5b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"Color attachment ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      std::ostream::operator<<((MessageBuilder *)local_208,iVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      std::ios_base::~ios_base(local_198);
      uVar44 = 0xf;
      if (local_5c8 != (undefined1  [8])&local_5b8) {
        uVar44 = local_5b8;
      }
      if (uVar44 < (ulong)((long)stack0xfffffffffffffad0 + (long)TStack_5c0)) {
        uVar44 = 0xf;
        if ((ulong *)local_538._0_8_ != local_528) {
          uVar44 = local_528[0];
        }
        if (uVar44 < (ulong)((long)stack0xfffffffffffffad0 + (long)TStack_5c0)) goto LAB_012e2c9d;
        pTVar23 = (TextureFormat *)
                  std::__cxx11::string::replace((ulong)local_538,0,(char *)0x0,(ulong)local_5c8);
      }
      else {
LAB_012e2c9d:
        pTVar23 = (TextureFormat *)std::__cxx11::string::_M_append(local_5c8,local_538._0_8_);
      }
      local_5e8 = (TextureFormat)&local_5d8;
      TVar62 = (TextureFormat)(pTVar23 + 2);
      if (*pTVar23 == TVar62) {
        local_5d8 = *(ulong *)TVar62;
        TStack_5d0 = pTVar23[3];
      }
      else {
        local_5d8 = *(ulong *)TVar62;
        local_5e8 = *pTVar23;
      }
      TStack_5e0 = pTVar23[1];
      *pTVar23 = TVar62;
      pTVar23[1].order = R;
      pTVar23[1].type = SNORM_INT8;
      *(undefined1 *)TVar62 = 0;
      if ((ulong *)local_538._0_8_ != local_528) {
        operator_delete((void *)local_538._0_8_,local_528[0] + 1);
      }
      if (local_5c8 != (undefined1  [8])&local_5b8) {
        operator_delete((void *)local_5c8,local_5b8 + 1);
      }
      local_208._0_4_ = local_478.order;
      local_208._4_4_ = local_478.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_200);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_200,"Attachment ",0xb);
      std::ostream::operator<<(&TStack_200,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_200,": ",2);
      std::ostream::operator<<(&TStack_200,local_568._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_200," channels have defined values and used for comparison",0x35
                );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_200);
      std::ios_base::~ios_base(local_190);
      if (TVar14 - TEXTURECHANNELCLASS_SIGNED_INTEGER < 2) {
        _local_5c8 = (uint  [4])ZEXT816(0);
        local_538._8_4_ = 0xffffffff;
        local_538._0_4_ = -NAN;
        local_538._4_4_ = -NAN;
        fStack_52c = -NAN;
        local_208._0_4_ = R;
        local_208._4_4_ = SNORM_INT8;
        TStack_200.order = R;
        TStack_200.type = SNORM_INT8;
        puVar27 = (undefined4 *)local_5c8;
        puVar35 = (undefined4 *)local_538;
        lVar41 = 0;
        do {
          puVar47 = puVar35;
          if (*(char *)((long)&local_428 + lVar41) != '\0') {
            puVar47 = puVar27;
          }
          *(undefined4 *)(local_208 + lVar41 * 4) = *puVar47;
          lVar41 = lVar41 + 1;
          puVar35 = puVar35 + 1;
          puVar27 = puVar27 + 1;
        } while (lVar41 != 4);
        bVar12 = tcu::intThresholdCompare
                           ((TestLog *)local_478,(char *)local_608,(char *)local_5e8,
                            (ConstPixelBufferAccess *)local_5a8,(ConstPixelBufferAccess *)local_388,
                            (UVec4 *)local_208,COMPARE_LOG_RESULT);
        uVar51 = local_4d8._0_4_;
      }
      else if (TVar14 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        lVar41 = 0;
        do {
          *(undefined4 *)(local_5c8 + lVar41 * 4) = 8;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        tcu::getTextureFormatBitDepth((tcu *)local_538,&pAVar54->format);
        uVar51 = local_4d8._0_4_;
        local_208._0_4_ = R;
        local_208._4_4_ = SNORM_INT8;
        TStack_200.order = R;
        TStack_200.type = SNORM_INT8;
        lVar41 = 0;
        do {
          iVar13 = *(int *)(local_538 + lVar41 * 4);
          if (*(int *)(local_5c8 + lVar41 * 4) < *(int *)(local_538 + lVar41 * 4)) {
            iVar13 = *(int *)(local_5c8 + lVar41 * 4);
          }
          *(int *)(local_208 + lVar41 * 4) = iVar13;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          local_3d8[lVar41] = 1.4013e-45;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        local_498[0] = 0;
        local_498[1] = 0;
        lVar41 = 0;
        do {
          bVar1 = local_208[lVar41 * 4];
          *(int *)((long)local_498 + lVar41 * 4) = (int)local_3d8[lVar41] << (bVar1 & 0x1f);
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        local_4f8.m_data[0] = 0.0;
        local_4f8.m_data[1] = 0.0;
        local_4f8.m_data[2] = 0.0;
        local_4f8.m_data[3] = 0.0;
        lVar41 = 0;
        do {
          local_4f8.m_data[lVar41] = (float)(*(int *)((long)local_498 + lVar41 * 4) + -1);
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        _local_538 = (float  [4])ZEXT816(0);
        lVar41 = 0;
        do {
          *(float *)(local_538 + lVar41 * 4) = (float)(int)local_4f8.m_data[lVar41];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        _local_5c8 = (uint  [4])ZEXT816(0);
        lVar41 = 0;
        do {
          *(float *)(local_5c8 + lVar41 * 4) = 1.0 / *(float *)(local_538 + lVar41 * 4);
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          local_4f8.m_data[lVar41] = 2.0;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        _local_538 = (float  [4])ZEXT816(0);
        pfVar28 = (float *)local_5c8;
        pfVar36 = local_4f8.m_data;
        uVar44 = (ulong)(uint)(0 << (bVar1 & 0x1f));
        do {
          pfVar48 = pfVar28;
          if (*(char *)((long)&local_428 + uVar44) == '\0') {
            pfVar48 = pfVar36;
          }
          *(float *)(local_538 + uVar44 * 4) = ((Vec4 *)pfVar48)->m_data[0];
          uVar44 = uVar44 + 1;
          pfVar36 = pfVar36 + 1;
          pfVar28 = pfVar28 + 1;
        } while (uVar44 != 4);
        bVar12 = tcu::floatThresholdCompare
                           ((TestLog *)local_478,(char *)local_608,(char *)local_5e8,
                            (ConstPixelBufferAccess *)local_5a8,(ConstPixelBufferAccess *)local_388,
                            (Vec4 *)local_538,COMPARE_LOG_RESULT);
      }
      else {
        if (TVar14 != TEXTURECHANNELCLASS_FLOATING_POINT) {
          pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar29,"Unsupported comparison",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                     ,0x3b4);
          __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        TVar62.order = R;
        TVar62.type = SNORM_INT8;
        TVar63.order = R;
        TVar63.type = SNORM_INT8;
        local_208._0_4_ = R;
        local_208._4_4_ = SNORM_INT8;
        TStack_200.order = R;
        TStack_200.type = SNORM_INT8;
        _local_5c8 = (uint  [4])ZEXT816(0);
        CVar52 = (pAVar54->format).type;
        uVar51 = local_4d8._0_4_;
        if (CVar52 == UNSIGNED_INT_11F_11F_10F_REV) {
          local_538._0_4_ = 0x20000;
          local_538._4_4_ = 0x20000;
          local_538._8_4_ = 0x40000;
          fStack_52c = 0.0;
LAB_012e30c5:
          local_208._0_4_ = (ChannelOrder)local_538._0_8_;
          local_208._4_4_ = SUB84(local_538._0_8_,4);
          TStack_200 = register0x00001208;
        }
        else {
          if (CVar52 == HALF_FLOAT) {
            lVar41 = 0;
            do {
              *(undefined4 *)(local_538 + lVar41 * 4) = 0x2000;
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            goto LAB_012e30c5;
          }
          local_538._0_8_ = TVar62;
          unique0x10007090 = TVar63;
          if (CVar52 == FLOAT) goto LAB_012e30c5;
        }
        uVar38 = 4;
        if ((int)local_540 == 1) {
          uVar38 = 0x2000;
        }
        if ((int)local_540 == 0) {
          uVar38 = 0x8000;
        }
        lVar41 = 0;
        do {
          *(undefined4 *)((long)local_498 + lVar41 * 4) = uVar38;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        local_4f8.m_data[0] = 0.0;
        local_4f8.m_data[1] = 0.0;
        local_4f8.m_data[2] = 0.0;
        local_4f8.m_data[3] = 0.0;
        lVar41 = 0;
        do {
          fVar64 = *(float *)((long)local_498 + lVar41 * 4);
          if ((uint)fVar64 < (uint)*(float *)(local_208 + lVar41 * 4)) {
            fVar64 = *(float *)(local_208 + lVar41 * 4);
          }
          local_4f8.m_data[lVar41] = fVar64;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        local_3d8[0] = -NAN;
        local_3d8[1] = -NAN;
        local_3d8[2] = -NAN;
        local_3d8[3] = -NAN;
        local_538._0_4_ = 0.0;
        local_538._4_4_ = 0.0;
        local_538._8_4_ = 0.0;
        fStack_52c = 0.0;
        pfVar28 = local_4f8.m_data;
        pfVar36 = local_3d8;
        lVar41 = 0;
        do {
          pfVar48 = pfVar36;
          if (*(char *)((long)&local_428 + lVar41) != '\0') {
            pfVar48 = pfVar28;
          }
          *(float *)(local_538 + lVar41 * 4) = ((Vec4 *)pfVar48)->m_data[0];
          lVar41 = lVar41 + 1;
          pfVar36 = pfVar36 + 1;
          pfVar28 = pfVar28 + 1;
        } while (lVar41 != 4);
        local_5c8._0_4_ = local_538._0_4_;
        local_5c8._4_4_ = local_538._4_4_;
        TStack_5c0.order = local_538._8_4_;
        TStack_5c0.type = (ChannelType)fStack_52c;
        bVar12 = tcu::floatUlpThresholdCompare
                           ((TestLog *)local_478,(char *)local_608,(char *)local_5e8,
                            (ConstPixelBufferAccess *)local_5a8,(ConstPixelBufferAccess *)local_388,
                            (UVec4 *)local_5c8,COMPARE_LOG_RESULT);
      }
      uVar51 = uVar51 & 0xff;
      if (bVar12 == false) {
        uVar51 = 0;
      }
      uVar44 = (ulong)uVar51;
      if (local_5e8 != (TextureFormat)&local_5d8) {
        operator_delete((void *)local_5e8,local_5d8 + 1);
      }
      if (local_608 != (undefined1  [8])&local_5f8) {
        operator_delete((void *)local_608,local_5f8 + 1);
      }
      uVar61 = uVar61 + 1;
    } while (uVar61 != (uVar37 & 0x7fffffff));
  }
  description = "Image comparison failed";
  if ((uVar44 & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(byte)uVar44 & QP_TEST_RESULT_FAIL,description);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ::~vector(&local_4c8);
  if (local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_3b8);
  return STOP;
}

Assistant:

FragmentOutputCase::IterateResult FragmentOutputCase::iterate (void)
{
	TestLog&					log					= m_testCtx.getLog();
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	// Compute grid size & index list.
	const int					minCellSize			= 8;
	const IVec2					minBufSize			= getMinSize(m_fboSpec);
	const int					gridWidth			= de::clamp(minBufSize.x()/minCellSize, 1, 255)+1;
	const int					gridHeight			= de::clamp(minBufSize.y()/minCellSize, 1, 255)+1;
	const int					numVertices			= gridWidth*gridHeight;
	const int					numQuads			= (gridWidth-1)*(gridHeight-1);
	const int					numIndices			= numQuads*6;

	const int					numInputVecs		= getNumInputVectors(m_outputs);
	vector<vector<deUint32> >	inputs				(numInputVecs);
	vector<float>				positions			(numVertices*4);
	vector<deUint16>			indices				(numIndices);

	const int					readAlignment		= 4;
	const int					viewportW			= minBufSize.x();
	const int					viewportH			= minBufSize.y();
	const int					numAttachments		= (int)m_fboSpec.size();

	vector<deUint32>			drawBuffers			(numAttachments);
	vector<AttachmentData>		attachments			(numAttachments);

	// Initialize attachment data.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_fboSpec[ndx].format);
		const tcu::TextureChannelClass	chnClass		= tcu::getTextureChannelClass(texFmt.type);
		const bool						isFixedPoint	= chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
														  chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;

		// \note Fixed-point formats use float reference to enable more accurate result verification.
		const tcu::TextureFormat		refFmt			= isFixedPoint ? tcu::TextureFormat(texFmt.order, tcu::TextureFormat::FLOAT) : texFmt;
		const tcu::TextureFormat		readFmt			= getFramebufferReadFormat(texFmt);
		const int						attachmentW		= m_fboSpec[ndx].width;
		const int						attachmentH		= m_fboSpec[ndx].height;

		drawBuffers[ndx]					= GL_COLOR_ATTACHMENT0+ndx;
		attachments[ndx].format				= texFmt;
		attachments[ndx].readFormat			= readFmt;
		attachments[ndx].referenceFormat	= refFmt;
		attachments[ndx].renderedData.resize(readFmt.getPixelSize()*attachmentW*attachmentH);
		attachments[ndx].referenceData.resize(refFmt.getPixelSize()*attachmentW*attachmentH);
	}

	// Initialize indices.
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (gridWidth-1);
		int quadX	= quadNdx - quadY*(gridWidth-1);

		indices[quadNdx*6+0] = deUint16(quadX + quadY*gridWidth);
		indices[quadNdx*6+1] = deUint16(quadX + (quadY+1)*gridWidth);
		indices[quadNdx*6+2] = deUint16(quadX + quadY*gridWidth + 1);
		indices[quadNdx*6+3] = indices[quadNdx*6+1];
		indices[quadNdx*6+4] = deUint16(quadX + (quadY+1)*gridWidth + 1);
		indices[quadNdx*6+5] = indices[quadNdx*6+2];
	}

	for (int y = 0; y < gridHeight; y++)
	{
		for (int x = 0; x < gridWidth; x++)
		{
			float	xf	= (float)x / (float)(gridWidth-1);
			float	yf	= (float)y / (float)(gridHeight-1);

			positions[(y*gridWidth + x)*4 + 0] = 2.0f*xf - 1.0f;
			positions[(y*gridWidth + x)*4 + 1] = 2.0f*yf - 1.0f;
			positions[(y*gridWidth + x)*4 + 2] = 0.0f;
			positions[(y*gridWidth + x)*4 + 3] = 1.0f;
		}
	}

	// Initialize input vectors.
	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output		= m_outputs[outputNdx];
			bool					isFloat		= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt		= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint		= glu::isDataTypeUintOrUVec(output.type);
			int						numVecs		= output.arrayLength > 0 ? output.arrayLength : 1;
			int						numScalars	= glu::getDataTypeScalarSize(output.type);

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				inputs[curInVec].resize(numVertices*numScalars);

				// Record how many outputs are written in attachment.
				DE_ASSERT(output.location+vecNdx < (int)attachments.size());
				attachments[output.location+vecNdx].numWrittenChannels	= numScalars;
				attachments[output.location+vecNdx].outPrecision		= output.precision;

				if (isFloat)
				{
					Vec2		range	= getFloatRange(output.precision);
					Vec4		minVal	(range.x());
					Vec4		maxVal	(range.y());
					float*		dst		= (float*)&inputs[curInVec][0];

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// \note Floating-point precision conversion is not well-defined. For that reason we must
						//       limit value range to intersection of both data type and render target value ranges.
						const tcu::TextureFormatInfo fmtInfo = tcu::getTextureFormatInfo(attachments[output.location+vecNdx].format);
						minVal = tcu::max(minVal, fmtInfo.valueMin);
						maxVal = tcu::min(maxVal, fmtInfo.valueMax);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							float	xf	= (float)x / (float)(gridWidth-1);
							float	yf	= (float)y / (float)(gridHeight-1);

							float	f0	= (xf + yf) * 0.5f;
							float	f1	= 0.5f + (xf - yf) * 0.5f;
							Vec4	f	= swizzleVec(Vec4(f0, f1, 1.0f-f0, 1.0f-f1), curInVec);
							Vec4	c	= minVal + (maxVal-minVal)*f;
							float*	v	= dst + (y*gridWidth + x)*numScalars;

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isInt)
				{
					const IVec2	range	= getIntRange(output.precision);
					IVec4		minVal	(range.x());
					IVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4 fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const BVec4	isZero		= lessThanEqual(fmtBits, IVec4(0));
						const IVec4	fmtMinVal	= (-(tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())).asInt();
						const IVec4	fmtMaxVal	= ((tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())-deInt64(1)).asInt();

						minVal = select(minVal, tcu::max(minVal, fmtMinVal), isZero);
						maxVal = select(maxVal, tcu::min(maxVal, fmtMaxVal), isZero);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const IVec4	step		= ((maxVal.cast<deInt64>() - minVal.cast<deInt64>()) / (rangeDiv.cast<deInt64>())).asInt();
					deInt32*	dst			= (deInt32*)&inputs[curInVec][0];

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							IVec4		c	= minVal + step*swizzleVec(IVec4(x, y, ix, iy), curInVec);
							deInt32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(logicalAnd(greaterThanEqual(c, minVal), lessThanEqual(c, maxVal))));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isUint)
				{
					const UVec2	range	= getUintRange(output.precision);
					UVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4	fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const UVec4	fmtMaxVal	= ((tcu::Vector<deUint64, 4>(1) << fmtBits.cast<deUint64>())-deUint64(1)).asUint();

						maxVal = tcu::min(maxVal, fmtMaxVal);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: "  << valueRangeToString(numScalars, UVec4(0), maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const UVec4	step		= maxVal / rangeDiv.asUint();
					deUint32*	dst			= &inputs[curInVec][0];

					DE_ASSERT(range.x() == 0);

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							UVec4		c	= step*swizzleVec(IVec4(x, y, ix, iy).asUint(), curInVec);
							deUint32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(lessThanEqual(c, maxVal)));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else
					DE_ASSERT(false);

				curInVec += 1;
			}
		}
	}

	// Render using gl.
	gl.useProgram(m_program->getProgram());
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.viewport(0, 0, viewportW, viewportH);
	gl.drawBuffers((int)drawBuffers.size(), &drawBuffers[0]);
	gl.disable(GL_DITHER); // Dithering causes issues with unorm formats. Those issues could be worked around in threshold, but it makes validation less accurate.
	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			bool					isArray			= output.arrayLength > 0;
			bool					isFloat			= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt			= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint			= glu::isDataTypeUintOrUVec(output.type);
			int						scalarSize		= glu::getDataTypeScalarSize(output.type);
			deUint32				glScalarType	= isFloat	? GL_FLOAT			:
													  isInt		? GL_INT			:
													  isUint	? GL_UNSIGNED_INT	: GL_NONE;
			int						numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				string	name	= string("in") + de::toString(outputNdx) + (isArray ? string("_") + de::toString(vecNdx) : string());
				int		loc		= gl.getAttribLocation(m_program->getProgram(), name.c_str());

				if (loc >= 0)
				{
					gl.enableVertexAttribArray(loc);
					if (isFloat)
						gl.vertexAttribPointer(loc, scalarSize, glScalarType, GL_FALSE, 0, &inputs[curInVec][0]);
					else
						gl.vertexAttribIPointer(loc, scalarSize, glScalarType, 0, &inputs[curInVec][0]);
				}
				else
					log << TestLog::Message << "Warning: No location for attribute '" << name << "' found." << TestLog::EndMessage;

				curInVec += 1;
			}
		}
	}
	{
		int posLoc = gl.getAttribLocation(m_program->getProgram(), "a_position");
		TCU_CHECK(posLoc >= 0);
		gl.enableVertexAttribArray(posLoc);
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "After attribute setup");

	gl.drawElements(GL_TRIANGLES, numIndices, GL_UNSIGNED_SHORT, &indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElements");

	// Read all attachment points.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const glu::TransferFormat		transferFmt			= glu::getTransferFormat(attachments[ndx].readFormat);
		void*							dst					= &attachments[ndx].renderedData[0];
		const int						attachmentW			= m_fboSpec[ndx].width;
		const int						attachmentH			= m_fboSpec[ndx].height;
		const int						numValidChannels	= attachments[ndx].numWrittenChannels;
		const tcu::PixelBufferAccess	rendered			(attachments[ndx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[ndx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[ndx].renderedData[0]);

		gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
		gl.readPixels(0, 0, minBufSize.x(), minBufSize.y(), transferFmt.format, transferFmt.dataType, dst);

		clearUndefined(rendered, numValidChannels);
	}

	// Render reference images.
	{
		int curInNdx = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			const bool				isArray			= output.arrayLength > 0;
			const bool				isFloat			= glu::isDataTypeFloatOrVec(output.type);
			const bool				isInt			= glu::isDataTypeIntOrIVec(output.type);
			const bool				isUint			= glu::isDataTypeUintOrUVec(output.type);
			const int				scalarSize		= glu::getDataTypeScalarSize(output.type);
			const int				numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				const int		location	= output.location+vecNdx;
				const void*		inputData	= &inputs[curInNdx][0];

				DE_ASSERT(de::inBounds(location, 0, (int)m_fboSpec.size()));

				const int						bufW			= m_fboSpec[location].width;
				const int						bufH			= m_fboSpec[location].height;
				const tcu::PixelBufferAccess	buf				(attachments[location].referenceFormat, bufW, bufH, 1, &attachments[location].referenceData[0]);
				const tcu::PixelBufferAccess	viewportBuf		= getSubregion(buf, 0, 0, 0, viewportW, viewportH, 1);

				if (isInt || isUint)
					renderIntReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const int*)inputData);
				else if (isFloat)
					renderFloatReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const float*)inputData);
				else
					DE_ASSERT(false);

				curInNdx += 1;
			}
		}
	}

	// Compare all images.
	bool allLevelsOk = true;
	for (int attachNdx = 0; attachNdx < numAttachments; attachNdx++)
	{
		const int						attachmentW			= m_fboSpec[attachNdx].width;
		const int						attachmentH			= m_fboSpec[attachNdx].height;
		const int						numValidChannels	= attachments[attachNdx].numWrittenChannels;
		const tcu::BVec4				cmpMask				(numValidChannels >= 1, numValidChannels >= 2, numValidChannels >= 3, numValidChannels >= 4);
		const glu::Precision			outPrecision		= attachments[attachNdx].outPrecision;
		const tcu::TextureFormat&		format				= attachments[attachNdx].format;
		tcu::ConstPixelBufferAccess		rendered			(attachments[attachNdx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[attachNdx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[attachNdx].renderedData[0]);
		tcu::ConstPixelBufferAccess		reference			(attachments[attachNdx].referenceFormat, attachmentW, attachmentH, 1, &attachments[attachNdx].referenceData[0]);
		tcu::TextureChannelClass		texClass			= tcu::getTextureChannelClass(format.type);
		bool							isOk				= true;
		const string					name				= string("Attachment") + de::toString(attachNdx);
		const string					desc				= string("Color attachment ") + de::toString(attachNdx);

		log << TestLog::Message << "Attachment " << attachNdx << ": " << numValidChannels << " channels have defined values and used for comparison" << TestLog::EndMessage;

		switch (texClass)
		{
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			{
				const deUint32	interpThreshold		= 4;	//!< 4 ULP interpolation threshold (interpolation always in highp)
				deUint32		outTypeThreshold	= 0;	//!< Threshold based on output type
				UVec4			formatThreshold;			//!< Threshold computed based on format.
				UVec4			finalThreshold;

				// 1 ULP rounding error is allowed for smaller floating-point formats
				switch (format.type)
				{
					case tcu::TextureFormat::FLOAT:							formatThreshold = UVec4(0);											break;
					case tcu::TextureFormat::HALF_FLOAT:					formatThreshold = UVec4((1<<(23-10)));								break;
					case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	formatThreshold = UVec4((1<<(23-6)), (1<<(23-6)), (1<<(23-5)), 0);	break;
					default:
						DE_ASSERT(false);
						break;
				}

				// 1 ULP rounding error for highp -> output precision cast
				switch (outPrecision)
				{
					case glu::PRECISION_LOWP:		outTypeThreshold	= (1<<(23-8));	break;
					case glu::PRECISION_MEDIUMP:	outTypeThreshold	= (1<<(23-10));	break;
					case glu::PRECISION_HIGHP:		outTypeThreshold	= 0;			break;
					default:
						DE_ASSERT(false);
				}

				finalThreshold = select(max(formatThreshold, UVec4(deMax32(interpThreshold, outTypeThreshold))), UVec4(~0u), cmpMask);

				isOk = tcu::floatUlpThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, finalThreshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			{
				// \note glReadPixels() allows only 8 bits to be read. This means that RGB10_A2 will loose some
				// bits in the process and it must be taken into account when computing threshold.
				const IVec4		bits			= min(IVec4(8), tcu::getTextureFormatBitDepth(format));
				const Vec4		baseThreshold	= 1.0f / ((IVec4(1) << bits)-1).asFloat();
				const Vec4		threshold		= select(baseThreshold, Vec4(2.0f), cmpMask);

				isOk = tcu::floatThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			{
				const tcu::UVec4 threshold = select(UVec4(0u), UVec4(~0u), cmpMask);
				isOk = tcu::intThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			default:
				TCU_FAIL("Unsupported comparison");
				break;
		}

		if (!isOk)
			allLevelsOk = false;
	}

	m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							allLevelsOk ? "Pass"				: "Image comparison failed");
	return STOP;
}